

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconintra.c
# Opt level: O0

int has_bottom_left(BLOCK_SIZE sb_size,BLOCK_SIZE bsize,int mi_row,int mi_col,int bottom_available,
                   int left_available,PARTITION_TYPE partition,TX_SIZE txsz,int row_off,int col_off,
                   int ss_x,int ss_y)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  uint8_t *puVar4;
  byte bVar5;
  uint in_ECX;
  uint in_EDX;
  int iVar6;
  BLOCK_SIZE in_SIL;
  byte in_DIL;
  int in_R8D;
  int in_R9D;
  uint8_t *has_bl_table;
  byte in_stack_00000010;
  int idx2;
  int idx1;
  int this_blk_index;
  int sb_height_unit;
  int row_off_in_sb;
  int blk_start_row_off;
  int blk_col_in_sb;
  int blk_row_in_sb;
  int sb_mi_size;
  int bh_in_mi_log2;
  int bw_in_mi_log2;
  int bottom_left_count_unit;
  int plane_bh_unit_1;
  int bh_unit;
  int plane_bh_unit;
  int row_off_64;
  int plane_bh_unit_64;
  int col_off_64;
  int plane_bw_unit_64;
  int local_78;
  int local_74;
  uint local_4;
  
  if ((in_R8D == 0) || (in_R9D == 0)) {
    local_4 = 0;
  }
  else {
    bVar5 = (byte)blk_row_in_sb;
    if (((block_size_wide[in_SIL] < 0x41) || (sb_height_unit < 1)) ||
       (sb_height_unit % (0x10 >> ((byte)blk_start_row_off & 0x1f)) != 0)) {
      if (sb_height_unit < 1) {
        if ((int)(uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                       [in_SIL] >> (bVar5 & 0x1f) < 2) {
          local_78 = 1;
        }
        else {
          local_78 = (int)(uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                                [in_SIL] >> (bVar5 & 0x1f);
        }
        if (idx1 + tx_size_high_unit[in_stack_00000010] < local_78) {
          local_4 = 1;
        }
        else {
          bVar1 = ""[in_SIL];
          uVar2 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                        [in_DIL];
          iVar6 = (int)(in_EDX & uVar2 - 1) >> (bVar1 & 0x1f);
          iVar3 = (int)(in_ECX & uVar2 - 1) >> (""[in_SIL] & 0x1f);
          if (iVar3 == 0) {
            local_4 = (uint)(((iVar6 << (bVar1 & 0x1f)) >> (bVar5 & 0x1f)) + idx1 +
                             tx_size_high_unit[in_stack_00000010] < (int)uVar2 >> (bVar5 & 0x1f));
          }
          else if (iVar6 + 1 << (bVar1 & 0x1f) < (int)uVar2) {
            iVar3 = (iVar6 << (5 - ""[in_SIL] & 0x1f)) + iVar3;
            puVar4 = get_has_bl_table((PARTITION_TYPE)has_bl_table,in_SIL);
            local_4 = (int)(uint)puVar4[iVar3 / 8] >> ((byte)(iVar3 % 8) & 0x1f) & 1;
          }
          else {
            local_4 = 0;
          }
        }
      }
      else {
        local_4 = 0;
      }
    }
    else {
      local_74 = 0x10 >> (bVar5 & 0x1f);
      iVar6 = idx1 % local_74;
      if ((int)(uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                     [in_SIL] >> (bVar5 & 0x1f) < local_74) {
        local_74 = (int)(uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                              [in_SIL] >> (bVar5 & 0x1f);
      }
      local_4 = (uint)(iVar6 + tx_size_high_unit[in_stack_00000010] < local_74);
    }
  }
  return local_4;
}

Assistant:

static int has_bottom_left(BLOCK_SIZE sb_size, BLOCK_SIZE bsize, int mi_row,
                           int mi_col, int bottom_available, int left_available,
                           PARTITION_TYPE partition, TX_SIZE txsz, int row_off,
                           int col_off, int ss_x, int ss_y) {
  if (!bottom_available || !left_available) return 0;

  // Special case for 128x* blocks, when col_off is half the block width.
  // This is needed because 128x* superblocks are divided into 64x* blocks in
  // raster order
  if (block_size_wide[bsize] > block_size_wide[BLOCK_64X64] && col_off > 0) {
    const int plane_bw_unit_64 = mi_size_wide[BLOCK_64X64] >> ss_x;
    const int col_off_64 = col_off % plane_bw_unit_64;
    if (col_off_64 == 0) {
      // We are at the left edge of top-right or bottom-right 64x* block.
      const int plane_bh_unit_64 = mi_size_high[BLOCK_64X64] >> ss_y;
      const int row_off_64 = row_off % plane_bh_unit_64;
      const int plane_bh_unit =
          AOMMIN(mi_size_high[bsize] >> ss_y, plane_bh_unit_64);
      // Check if all bottom-left pixels are in the left 64x* block (which is
      // already coded).
      return row_off_64 + tx_size_high_unit[txsz] < plane_bh_unit;
    }
  }

  if (col_off > 0) {
    // Bottom-left pixels are in the bottom-left block, which is not available.
    return 0;
  } else {
    const int bh_unit = mi_size_high[bsize];
    const int plane_bh_unit = AOMMAX(bh_unit >> ss_y, 1);
    const int bottom_left_count_unit = tx_size_high_unit[txsz];

    // All bottom-left pixels are in the left block, which is already available.
    if (row_off + bottom_left_count_unit < plane_bh_unit) return 1;

    const int bw_in_mi_log2 = mi_size_wide_log2[bsize];
    const int bh_in_mi_log2 = mi_size_high_log2[bsize];
    const int sb_mi_size = mi_size_high[sb_size];
    const int blk_row_in_sb = (mi_row & (sb_mi_size - 1)) >> bh_in_mi_log2;
    const int blk_col_in_sb = (mi_col & (sb_mi_size - 1)) >> bw_in_mi_log2;

    // Leftmost column of superblock: so bottom-left pixels maybe in the left
    // and/or bottom-left superblocks. But only the left superblock is
    // available, so check if all required pixels fall in that superblock.
    if (blk_col_in_sb == 0) {
      const int blk_start_row_off =
          blk_row_in_sb << (bh_in_mi_log2 + MI_SIZE_LOG2 - MI_SIZE_LOG2) >>
          ss_y;
      const int row_off_in_sb = blk_start_row_off + row_off;
      const int sb_height_unit = sb_mi_size >> ss_y;
      return row_off_in_sb + bottom_left_count_unit < sb_height_unit;
    }

    // Bottom row of superblock (and not the leftmost column): so bottom-left
    // pixels fall in the bottom superblock, which is not available yet.
    if (((blk_row_in_sb + 1) << bh_in_mi_log2) >= sb_mi_size) return 0;

    // General case (neither leftmost column nor bottom row): check if the
    // bottom-left block is coded before the current block.
    const int this_blk_index =
        ((blk_row_in_sb + 0) << (MAX_MIB_SIZE_LOG2 - bw_in_mi_log2)) +
        blk_col_in_sb + 0;
    const int idx1 = this_blk_index / 8;
    const int idx2 = this_blk_index % 8;
    const uint8_t *has_bl_table = get_has_bl_table(partition, bsize);
    return (has_bl_table[idx1] >> idx2) & 1;
  }
}